

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

Visibility slang::ast::Lookup::getVisibility(Symbol *symbol)

{
  SymbolKind SVar1;
  Visibility VVar2;
  
  SVar1 = symbol->kind;
  VVar2 = Public;
  if ((int)SVar1 < 0x40) {
    if (SVar1 == TypeAlias) {
      VVar2 = (Visibility)symbol[2].name._M_len;
    }
    else {
      VVar2 = Public;
      if (SVar1 == ClassProperty) {
        return *(Visibility *)&symbol[5].location;
      }
    }
  }
  else {
    if (SVar1 == Subroutine) {
      return symbol[3].kind;
    }
    if (SVar1 == MethodPrototype) {
      return *(Visibility *)((long)&symbol[2].originatingSyntax + 4);
    }
  }
  return VVar2;
}

Assistant:

Visibility Lookup::getVisibility(const Symbol& symbol) {
    switch (symbol.kind) {
        case SymbolKind::MethodPrototype:
            return symbol.as<MethodPrototypeSymbol>().visibility;
        case SymbolKind::ClassProperty:
            return symbol.as<ClassPropertySymbol>().visibility;
        case SymbolKind::Subroutine:
            return symbol.as<SubroutineSymbol>().visibility;
        case SymbolKind::TypeAlias:
            return symbol.as<TypeAliasType>().visibility;
        default:
            return Visibility::Public;
    }
}